

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_crop
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,int x0,int y0,int z0,
          int c0,int x1,int y1,int z1,int c1,bool boundary_conditions)

{
  uint uVar1;
  CImg<unsigned_int> *this_00;
  CImgInstanceException *this_01;
  uint uVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  long local_80;
  long local_70;
  long local_60;
  long local_50;
  
  if ((((this->_data != (uint *)0x0) && (this->_width != 0)) && (this->_height != 0)) &&
     ((this->_depth != 0 && (this->_spectrum != 0)))) {
    uVar1 = x1;
    if (x0 < x1) {
      uVar1 = x0;
    }
    uVar2 = x1 ^ x0 ^ uVar1;
    uVar5 = y1;
    if (y0 < y1) {
      uVar5 = y0;
    }
    uVar10 = y1 ^ y0 ^ uVar5;
    uVar6 = z1;
    if (z0 < z1) {
      uVar6 = z0;
    }
    uVar9 = z1 ^ z0 ^ uVar6;
    uVar8 = c1;
    if (c0 < c1) {
      uVar8 = c0;
    }
    uVar11 = c1 ^ c0 ^ uVar8;
    CImg(__return_storage_ptr__,(uVar2 - uVar1) + 1,(uVar10 - uVar5) + 1,(uVar9 - uVar6) + 1,
         (uVar11 - uVar8) + 1);
    if ((((int)uVar1 < 0) || ((int)uVar5 < 0)) ||
       (((int)this->_width <= (int)uVar2 ||
        (((((int)uVar6 < 0 || ((int)this->_height <= (int)uVar10)) || ((int)uVar8 < 0)) ||
         (((int)this->_depth <= (int)uVar9 ||
          (this_00 = __return_storage_ptr__, (int)this->_spectrum <= (int)uVar11)))))))) {
      if (boundary_conditions) {
        if ((int)__return_storage_ptr__->_spectrum < 1) {
          return __return_storage_ptr__;
        }
        if (x1 < x0) {
          x0 = x1;
        }
        local_80 = 0;
        local_70 = 0;
        do {
          if (0 < (int)__return_storage_ptr__->_depth) {
            lVar12 = 0;
            local_60 = 0;
            do {
              if (0 < (int)__return_storage_ptr__->_height) {
                lVar3 = 0;
                local_50 = 0;
                do {
                  if (0 < (int)__return_storage_ptr__->_width) {
                    lVar4 = 0;
                    do {
                      uVar1 = _atXYZC(this,x0 + (int)lVar4,uVar5 + (int)local_50,
                                      uVar6 + (int)local_60,uVar8 + (int)local_70);
                      *(uint *)((long)__return_storage_ptr__->_data +
                               lVar4 * 4 +
                               (((ulong)__return_storage_ptr__->_depth * local_80 + lVar12) *
                                (ulong)__return_storage_ptr__->_height + lVar3) *
                               (ulong)__return_storage_ptr__->_width) = uVar1;
                      lVar4 = lVar4 + 1;
                    } while (lVar4 < (int)__return_storage_ptr__->_width);
                  }
                  local_50 = local_50 + 1;
                  lVar3 = lVar3 + 4;
                } while (local_50 < (int)__return_storage_ptr__->_height);
              }
              local_60 = local_60 + 1;
              lVar12 = lVar12 + 4;
            } while (local_60 < (int)__return_storage_ptr__->_depth);
          }
          local_70 = local_70 + 1;
          local_80 = local_80 + 4;
        } while (local_70 < (int)__return_storage_ptr__->_spectrum);
        return __return_storage_ptr__;
      }
      this_00 = fill(__return_storage_ptr__,0);
    }
    draw_image(this_00,-uVar1,-uVar5,-uVar6,-uVar8,this,1.0);
    return __return_storage_ptr__;
  }
  this_01 = (CImgInstanceException *)__cxa_allocate_exception(0x4008);
  pcVar7 = "non-";
  if (this->_is_shared != false) {
    pcVar7 = "";
  }
  CImgInstanceException::CImgInstanceException
            (this_01,"[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::crop(): Empty instance.",
             (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
             this->_data,pcVar7,"unsigned int");
  __cxa_throw(this_01,&CImgInstanceException::typeinfo,std::exception::~exception);
}

Assistant:

CImg<T> get_crop(const int x0, const int y0, const int z0, const int c0,
                     const int x1, const int y1, const int z1, const int c1,
                     const bool boundary_conditions=false) const {
      if (is_empty())
        throw CImgInstanceException(_cimg_instance
                                    "crop(): Empty instance.",
                                    cimg_instance);
      const int
        nx0 = x0<x1?x0:x1, nx1 = x0^x1^nx0,
        ny0 = y0<y1?y0:y1, ny1 = y0^y1^ny0,
        nz0 = z0<z1?z0:z1, nz1 = z0^z1^nz0,
        nc0 = c0<c1?c0:c1, nc1 = c0^c1^nc0;
      CImg<T> res(1U + nx1 - nx0,1U + ny1 - ny0,1U + nz1 - nz0,1U + nc1 - nc0);
      if (nx0<0 || nx1>=width() || ny0<0 || ny1>=height() || nz0<0 || nz1>=depth() || nc0<0 || nc1>=spectrum()) {
        if (boundary_conditions) cimg_forXYZC(res,x,y,z,c) res(x,y,z,c) = _atXYZC(nx0+x,ny0+y,nz0+z,nc0+c);
        else res.fill(0).draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      } else res.draw_image(-nx0,-ny0,-nz0,-nc0,*this);
      return res;
    }